

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemTransfer(LLVMPointerGraphBuilder *this,IntrinsicInst *I)

{
  ID IVar1;
  PSNode *pPVar2;
  PSNode *args;
  CallBase *in_RDI;
  PSNode *node;
  PSNode *srcNode;
  PSNode *destNode;
  uint64_t lenVal;
  Value *src;
  Value *dest;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  raw_ostream *in_stack_ffffffffffffffc0;
  
  IVar1 = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)0x1bb091);
  if ((IVar1 != 0xbf) && (IVar1 != 0xc2)) {
    llvm::errs();
    llvm::raw_ostream::operator<<
              (in_stack_ffffffffffffffc0,(char *)CONCAT44(IVar1,in_stack_ffffffffffffffb8));
    llvm::operator<<((raw_ostream *)in_RDI,
                     (Value *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    llvm::raw_ostream::operator<<
              (in_stack_ffffffffffffffc0,(char *)CONCAT44(IVar1,in_stack_ffffffffffffffb8));
    abort();
  }
  llvm::CallBase::getOperand(in_RDI,in_stack_ffffffffffffffac);
  llvm::CallBase::getOperand(in_RDI,in_stack_ffffffffffffffac);
  llvm::CallBase::getOperand(in_RDI,in_stack_ffffffffffffffac);
  llvmutils::getConstantValue((Value *)in_RDI);
  pPVar2 = getOperand((LLVMPointerGraphBuilder *)CONCAT44(IVar1,in_stack_ffffffffffffffb8),
                      (Value *)in_RDI);
  args = getOperand((LLVMPointerGraphBuilder *)CONCAT44(IVar1,in_stack_ffffffffffffffb8),
                    (Value *)in_RDI);
  pPVar2 = PointerGraph::
           create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNode*&,unsigned_long&>
                     ((PointerGraph *)pPVar2,(PSNode **)args,(PSNode **)in_stack_ffffffffffffffc0,
                      (unsigned_long *)CONCAT44(IVar1,in_stack_ffffffffffffffb8));
  return pPVar2;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createMemTransfer(const llvm::IntrinsicInst *I) {
    using namespace llvm;
    const Value *dest, *src; //, *lenVal;
    uint64_t lenVal = Offset::UNKNOWN;

    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
        dest = I->getOperand(0);
        src = I->getOperand(1);
        lenVal = llvmutils::getConstantValue(I->getOperand(2));
        break;
    default:
        errs() << "ERR: unhandled mem transfer intrinsic" << *I << "\n";
        abort();
    }

    PSNode *destNode = getOperand(dest);
    PSNode *srcNode = getOperand(src);
    PSNode *node = PS.create<PSNodeType::MEMCPY>(srcNode, destNode, lenVal);

    return node;
}